

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool __thiscall tinyxml2::XMLComment::ShallowEqual(XMLComment *this,XMLNode *compare)

{
  int iVar1;
  undefined4 extraout_var;
  char *p;
  char *q;
  bool local_21;
  XMLComment *comment;
  XMLNode *compare_local;
  XMLComment *this_local;
  
  iVar1 = (*compare->_vptr_XMLNode[8])();
  local_21 = false;
  if ((XMLNode *)CONCAT44(extraout_var,iVar1) != (XMLNode *)0x0) {
    p = XMLNode::Value((XMLNode *)CONCAT44(extraout_var,iVar1));
    q = XMLNode::Value(&this->super_XMLNode);
    local_21 = XMLUtil::StringEqual(p,q,0x7fffffff);
  }
  return local_21;
}

Assistant:

bool XMLComment::ShallowEqual( const XMLNode* compare ) const
{
    TIXMLASSERT( compare );
    const XMLComment* comment = compare->ToComment();
    return ( comment && XMLUtil::StringEqual( comment->Value(), Value() ));
}